

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-parser.c++
# Opt level: O0

Orphan<capnp::compiler::ParsedFile> * __thiscall
capnp::SchemaParser::ModuleImpl::loadContent
          (Orphan<capnp::compiler::ParsedFile> *__return_storage_ptr__,ModuleImpl *this,
          Orphanage orphanage)

{
  Builder result;
  Reader statements_00;
  Builder result_00;
  SchemaFile *pSVar1;
  BuilderFor<capnp::compiler::ParsedFile> local_240;
  Builder local_218;
  Reader local_1f0;
  undefined1 local_1b9;
  SegmentBuilder *local_1b8;
  SegmentBuilder *pSStack_1b0;
  CapTableBuilder *local_1a8;
  void *pvStack_1a0;
  WirePointer *local_198;
  ArrayPtr<const_char> local_188;
  undefined1 auStack_178 [8];
  Builder statements;
  MallocMessageBuilder lexedBuilder;
  undefined1 *local_48;
  undefined1 local_40 [8];
  Array<const_char> content;
  ModuleImpl *this_local;
  Orphanage orphanage_local;
  Orphan<capnp::compiler::ParsedFile> *parsed;
  
  orphanage_local.arena = (BuilderArena *)orphanage.capTable;
  this_local = (ModuleImpl *)orphanage.arena;
  content.disposer = (ArrayDisposer *)this;
  orphanage_local.capTable = (CapTableBuilder *)__return_storage_ptr__;
  pSVar1 = kj::Own<const_capnp::SchemaFile,_std::nullptr_t>::operator->(&this->file);
  (*pSVar1->_vptr_SchemaFile[1])();
  local_48 = local_40;
  kj::Lazy<kj::Vector<unsigned_int>>::
  get<capnp::SchemaParser::ModuleImpl::loadContent(capnp::Orphanage)::_lambda(kj::SpaceFor<kj::Vector<unsigned_int>>&)_1_>
            ((Lazy<kj::Vector<unsigned_int>> *)&this->lineBreaks,&local_48);
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)&statements._builder.dataSize,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnp::compiler::LexedStatements>
            ((Builder *)auStack_178,(MessageBuilder *)&statements._builder.dataSize);
  local_188 = kj::Array::operator_cast_to_ArrayPtr((Array *)local_40);
  local_198 = statements._builder.pointers;
  local_1a8 = statements._builder.capTable;
  pvStack_1a0 = statements._builder.data;
  local_1b8 = (SegmentBuilder *)auStack_178;
  pSStack_1b0 = statements._builder.segment;
  result._builder.capTable = (CapTableBuilder *)statements._builder.segment;
  result._builder.segment = (SegmentBuilder *)auStack_178;
  result._builder.data = statements._builder.capTable;
  result._builder.pointers = (WirePointer *)statements._builder.data;
  result._builder._32_8_ = statements._builder.pointers;
  capnp::compiler::lex(local_188,result,(ErrorReporter *)this);
  local_1b9 = 0;
  Orphanage::newOrphan<capnp::compiler::ParsedFile>(__return_storage_ptr__,(Orphanage *)&this_local)
  ;
  capnp::compiler::LexedStatements::Builder::getStatements(&local_218,(Builder *)auStack_178);
  List::Builder::operator_cast_to_Reader(&local_1f0,(Builder *)&local_218);
  Orphan<capnp::compiler::ParsedFile>::get(&local_240,__return_storage_ptr__);
  statements_00.reader.capTable = local_1f0.reader.capTable;
  statements_00.reader.segment = local_1f0.reader.segment;
  statements_00.reader.ptr = local_1f0.reader.ptr;
  statements_00.reader.elementCount = local_1f0.reader.elementCount;
  statements_00.reader.step = local_1f0.reader.step;
  statements_00.reader.structDataSize = local_1f0.reader.structDataSize;
  statements_00.reader.structPointerCount = local_1f0.reader.structPointerCount;
  statements_00.reader.elementSize = local_1f0.reader.elementSize;
  statements_00.reader._39_1_ = local_1f0.reader._39_1_;
  statements_00.reader.nestingLimit = local_1f0.reader.nestingLimit;
  statements_00.reader._44_4_ = local_1f0.reader._44_4_;
  result_00._builder.capTable = local_240._builder.capTable;
  result_00._builder.segment = local_240._builder.segment;
  result_00._builder.data = local_240._builder.data;
  result_00._builder.pointers = local_240._builder.pointers;
  result_00._builder.dataSize = local_240._builder.dataSize;
  result_00._builder.pointerCount = local_240._builder.pointerCount;
  result_00._builder._38_2_ = local_240._builder._38_2_;
  capnp::compiler::parseFile
            (statements_00,result_00,(ErrorReporter *)this,(bool)(this->parser->fileIdsRequired & 1)
            );
  local_1b9 = 1;
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&statements._builder.dataSize)
  ;
  kj::Array<const_char>::~Array((Array<const_char> *)local_40);
  return __return_storage_ptr__;
}

Assistant:

Orphan<compiler::ParsedFile> loadContent(Orphanage orphanage) override {
    kj::Array<const char> content = file->readContent();

    lineBreaks.get([&](kj::SpaceFor<kj::Vector<uint>>& space) {
      auto vec = space.construct(content.size() / 40);
      vec->add(0);
      for (const char* pos = content.begin(); pos < content.end(); ++pos) {
        if (*pos == '\n') {
          vec->add(pos + 1 - content.begin());
        }
      }
      return vec;
    });

    MallocMessageBuilder lexedBuilder;
    auto statements = lexedBuilder.initRoot<compiler::LexedStatements>();
    compiler::lex(content, statements, *this);

    auto parsed = orphanage.newOrphan<compiler::ParsedFile>();
    compiler::parseFile(statements.getStatements(), parsed.get(), *this, parser.fileIdsRequired);
    return parsed;
  }